

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrcSymTable.cpp
# Opt level: O2

void __thiscall
GrcSymbolTableEntry::ReplaceClassData(GrcSymbolTableEntry *this,GdlGlyphClassDefn *pglfc)

{
  long *plVar1;
  
  if (this->m_pData != (GdlDefn *)0x0) {
    plVar1 = (long *)__dynamic_cast(this->m_pData,&GdlDefn::typeinfo,&GdlGlyphClassDefn::typeinfo,0)
    ;
    (**(code **)(*plVar1 + 0xd0))(plVar1);
    if (this->m_pData != (GdlDefn *)0x0) {
      (*this->m_pData->_vptr_GdlDefn[1])();
    }
  }
  this->m_pData = (GdlDefn *)pglfc;
  this->m_fHasData = true;
  return;
}

Assistant:

void GrcSymbolTableEntry::ReplaceClassData(GdlGlyphClassDefn * pglfc)
{
	if (m_pData)
	{
		// Empty class is being deleted.
		GdlGlyphClassDefn * pglfcDelete = dynamic_cast<GdlGlyphClassDefn *>(m_pData);
		Assert(pglfcDelete);
		Assert(pglfcDelete->Name() == "");
		pglfcDelete->ComputeMembers();
		Assert(pglfcDelete->GlyphIDCount() == 0);
		delete m_pData;
	}
	SetData(pglfc);
}